

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleRenderInstance::logTestPlan
          (ImageSampleRenderInstance *this)

{
  ostringstream *this_00;
  ShaderInputInterface SVar1;
  ostream *poVar2;
  int resultNdx;
  uint samplePosNdx;
  char *pcVar3;
  ostringstream msg;
  string asStack_348 [32];
  ostringstream local_328 [376];
  undefined1 local_1b0 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_328);
  std::operator<<((ostream *)local_328,"Rendering 2x2 grid.\n");
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
    poVar2 = std::operator<<((ostream *)local_328,"Single descriptor set. Descriptor set contains ")
    ;
    SVar1 = this->m_shaderInterface;
    if ((ulong)SVar1 < 3) {
      pcVar3 = *(char **)(&DAT_00bd0cb8 + (ulong)SVar1 * 8);
    }
    else {
      pcVar3 = (char *)0x0;
      if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar3 = "an array (size 2) of";
      }
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = " VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n";
  }
  else {
    if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) goto LAB_00542db7;
    poVar2 = std::operator<<((ostream *)local_328,"Single descriptor set. Descriptor set contains ")
    ;
    SVar1 = this->m_shaderInterface;
    if ((ulong)SVar1 < 3) {
      pcVar3 = *(char **)(&DAT_00bd0cb8 + (ulong)SVar1 * 8);
    }
    else {
      pcVar3 = (char *)0x0;
      if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar3 = "an array (size 2) of";
      }
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = " VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n";
  }
  std::operator<<(poVar2,pcVar3);
LAB_00542db7:
  poVar2 = std::operator<<((ostream *)local_328,"Image view type is ");
  pcVar3 = ::vk::getImageViewTypeName(this->m_viewType);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  if (this->m_baseMipLevel != 0) {
    poVar2 = std::operator<<((ostream *)local_328,"Image view base mip level = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
  }
  if (this->m_baseArraySlice != 0) {
    poVar2 = std::operator<<((ostream *)local_328,"Image view base array slice = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
  }
  pcVar3 = "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n";
  if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pcVar3 = "Sampler mode is LINEAR, with WRAP\n";
  }
  poVar2 = (ostream *)local_328;
  std::operator<<(poVar2,pcVar3);
  if (this->m_stageFlags == 0) {
    pcVar3 = "Descriptors are not accessed in any shader stage.\n";
  }
  else {
    std::operator<<((ostream *)local_328,"Color in each cell is fetched using the descriptor(s):\n")
    ;
    for (samplePosNdx = 0; samplePosNdx != 4; samplePosNdx = samplePosNdx + 1) {
      poVar2 = std::operator<<((ostream *)local_328,"Test sample ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,samplePosNdx);
      poVar2 = std::operator<<(poVar2,": sample at position ");
      ImageSampleInstanceImages::getSamplePos
                ((ImageSampleInstanceImages *)local_1b0,this->m_viewType,this->m_baseMipLevel,
                 this->m_baseArraySlice,samplePosNdx);
      tcu::operator<<(poVar2,(Vector<float,_4> *)local_1b0);
      if (this->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
        pcVar3 = " from combined image sampler ";
        if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
          if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) goto LAB_00542f4f;
          pcVar3 = " using sampler ";
        }
        poVar2 = std::operator<<((ostream *)local_328,pcVar3);
        std::ostream::operator<<(poVar2,samplePosNdx & 1);
      }
LAB_00542f4f:
      std::operator<<((ostream *)local_328,"\n");
    }
    poVar2 = std::operator<<((ostream *)local_328,"Descriptors are accessed in {");
    pcVar3 = " vertex";
    if ((this->m_stageFlags & 1) == 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = " tess_control";
    if ((this->m_stageFlags & 2) == 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = " tess_evaluation";
    if ((this->m_stageFlags & 4) == 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = " geometry";
    if ((this->m_stageFlags & 8) == 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = " fragment";
    if ((this->m_stageFlags & 0x10) == 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = " } stages.";
  }
  std::operator<<(poVar2,pcVar3);
  local_1b0._0_8_ =
       ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
       m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,asStack_348);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string(asStack_348);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::ostringstream::~ostringstream(local_328);
  return;
}

Assistant:

void ImageSampleRenderInstance::logTestPlan (void) const
{
	std::ostringstream msg;

	msg << "Rendering 2x2 grid.\n";

	if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
	{
		msg << "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
				(m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
			<< " VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n";
	}
	else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
	{
		msg << "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
				(m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
			<< " VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n";
	}
	else
		DE_FATAL("Impossible");

	msg << "Image view type is " << vk::getImageViewTypeName(m_viewType) << "\n";

	if (m_baseMipLevel)
		msg << "Image view base mip level = " << m_baseMipLevel << "\n";
	if (m_baseArraySlice)
		msg << "Image view base array slice = " << m_baseArraySlice << "\n";

	if (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)
		msg << "Sampler mode is LINEAR, with WRAP\n";
	else
		msg << "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n";

	if (m_stageFlags == 0u)
	{
		msg << "Descriptors are not accessed in any shader stage.\n";
	}
	else
	{
		msg << "Color in each cell is fetched using the descriptor(s):\n";

		for (int resultNdx = 0; resultNdx < 4; ++resultNdx)
		{
			msg << "Test sample " << resultNdx << ": sample at position " << m_images.getSamplePos(m_viewType, m_baseMipLevel, m_baseArraySlice, resultNdx);

			if (m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR)
			{
				const int srcResourceNdx = (resultNdx % 2); // ABAB source

				if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
					msg << " using sampler " << srcResourceNdx;
				else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
					msg << " from combined image sampler " << srcResourceNdx;
				else
					DE_FATAL("Impossible");
			}
			msg << "\n";
		}

		msg << "Descriptors are accessed in {"
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0)					? (" vertex")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0)	? (" tess_control")		: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0)	? (" tess_evaluation")	: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0)				? (" geometry")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0)				? (" fragment")			: (""))
			<< " } stages.";
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< msg.str()
		<< tcu::TestLog::EndMessage;
}